

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int fp_compute_max_mb_rows(AV1_COMMON *cm,BLOCK_SIZE fp_block_size)

{
  int iVar1;
  byte bVar2;
  int local_44;
  int local_40;
  int num_mb_rows_in_tile;
  int mi_row_end;
  int mi_row_start;
  int row;
  int max_mb_rows;
  int *row_start_sb;
  int num_mi_rows;
  int mib_size_log2;
  int unit_height_log2;
  int tile_rows;
  BLOCK_SIZE fp_block_size_local;
  AV1_COMMON *cm_local;
  
  iVar1 = (cm->mi_params).mi_rows;
  max_mb_rows = 0;
  for (row = 0; row < (cm->tiles).rows; row = row + 1) {
    bVar2 = (byte)cm->seq_params->mib_size_log2;
    local_40 = iVar1;
    if ((cm->tiles).row_start_sb[row + 1] << (bVar2 & 0x1f) < iVar1) {
      local_40 = (cm->tiles).row_start_sb[row + 1] << (bVar2 & 0x1f);
    }
    local_44 = (local_40 - ((cm->tiles).row_start_sb[row] << (bVar2 & 0x1f))) +
               (1 << (""[fp_block_size] & 0x1f)) + -1 >> (""[fp_block_size] & 0x1f);
    if (local_44 < max_mb_rows) {
      local_44 = max_mb_rows;
    }
    max_mb_rows = local_44;
  }
  return max_mb_rows;
}

Assistant:

static inline int fp_compute_max_mb_rows(const AV1_COMMON *cm,
                                         BLOCK_SIZE fp_block_size) {
  const int tile_rows = cm->tiles.rows;
  const int unit_height_log2 = mi_size_high_log2[fp_block_size];
  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  const int num_mi_rows = cm->mi_params.mi_rows;
  const int *const row_start_sb = cm->tiles.row_start_sb;
  int max_mb_rows = 0;

  for (int row = 0; row < tile_rows; row++) {
    const int mi_row_start = row_start_sb[row] << mib_size_log2;
    const int mi_row_end =
        AOMMIN(row_start_sb[row + 1] << mib_size_log2, num_mi_rows);
    const int num_mb_rows_in_tile =
        CEIL_POWER_OF_TWO(mi_row_end - mi_row_start, unit_height_log2);
    max_mb_rows = AOMMAX(max_mb_rows, num_mb_rows_in_tile);
  }
  return max_mb_rows;
}